

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ba_linear_solver.cc
# Opt level: O2

void sfm::ba::anon_unknown_4::matrix_block_column_multiply
               (SparseMatrix<double> *A,size_t block_size,SparseMatrix<double> *B)

{
  pointer pTVar1;
  pointer pDVar2;
  ulong uVar3;
  long lVar4;
  pointer pTVar5;
  size_t col;
  ulong uVar6;
  ulong uVar7;
  undefined1 local_d8 [8];
  vector<sfm::ba::DenseVector<double>,_std::allocator<sfm::ba::DenseVector<double>_>_> columns;
  undefined1 auStack_88 [8];
  Triplets triplets;
  pointer local_68;
  pointer local_58;
  pointer local_50;
  double local_48;
  double dot;
  size_t local_38;
  
  triplets.
  super__Vector_base<sfm::ba::SparseMatrix<double>::Triplet,_std::allocator<sfm::ba::SparseMatrix<double>::Triplet>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  auStack_88 = (undefined1  [8])0x0;
  triplets.
  super__Vector_base<sfm::ba::SparseMatrix<double>::Triplet,_std::allocator<sfm::ba::SparseMatrix<double>::Triplet>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_38 = block_size;
  std::
  vector<sfm::ba::SparseMatrix<double>::Triplet,_std::allocator<sfm::ba::SparseMatrix<double>::Triplet>_>
  ::reserve((vector<sfm::ba::SparseMatrix<double>::Triplet,_std::allocator<sfm::ba::SparseMatrix<double>::Triplet>_>
             *)auStack_88,A->cols * block_size);
  local_58 = (pointer)0x1;
  uVar7 = 0;
  while( true ) {
    uVar6 = A->cols;
    if (uVar6 <= uVar7) break;
    std::vector<sfm::ba::DenseVector<double>,_std::allocator<sfm::ba::DenseVector<double>_>_>::
    vector((vector<sfm::ba::DenseVector<double>,_std::allocator<sfm::ba::DenseVector<double>_>_> *)
           local_d8,local_38,(allocator_type *)&local_48);
    lVar4 = 0;
    for (uVar6 = 0; local_38 != uVar6; uVar6 = uVar6 + 1) {
      SparseMatrix<double>::column_nonzeros
                (A,uVar7 + uVar6,
                 (DenseVector<double> *)
                 ((long)&(((vector<double,_std::allocator<double>_> *)local_d8)->
                         super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                         super__Vector_impl_data._M_start + lVar4));
      lVar4 = lVar4 + 0x18;
    }
    local_68 = (pointer)0x18;
    uVar6 = 0;
    pTVar1 = local_58;
    while( true ) {
      if (uVar6 == local_38) break;
      triplets.
      super__Vector_base<sfm::ba::SparseMatrix<double>::Triplet,_std::allocator<sfm::ba::SparseMatrix<double>::Triplet>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = pTVar1;
      local_48 = DenseVector<double>::dot
                           ((DenseVector<double> *)((long)local_d8 + uVar6 * 0x18),
                            (DenseVector<double> *)((long)local_d8 + uVar6 * 0x18));
      pTVar1 = (pointer)(uVar6 + uVar7);
      local_50 = pTVar1;
      dot = (double)pTVar1;
      std::
      vector<sfm::ba::SparseMatrix<double>::Triplet,std::allocator<sfm::ba::SparseMatrix<double>::Triplet>>
      ::emplace_back<unsigned_long,unsigned_long,double&>
                ((vector<sfm::ba::SparseMatrix<double>::Triplet,std::allocator<sfm::ba::SparseMatrix<double>::Triplet>>
                  *)auStack_88,(unsigned_long *)&local_50,(unsigned_long *)&dot,&local_48);
      pDVar2 = local_68;
      uVar3 = uVar6 + 1;
      pTVar5 = triplets.
               super__Vector_base<sfm::ba::SparseMatrix<double>::Triplet,_std::allocator<sfm::ba::SparseMatrix<double>::Triplet>_>
               ._M_impl.super__Vector_impl_data._M_end_of_storage;
      while( true ) {
        if (local_38 <= uVar3) break;
        columns.
        super__Vector_base<sfm::ba::DenseVector<double>,_std::allocator<sfm::ba::DenseVector<double>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage = pDVar2;
        local_48 = DenseVector<double>::dot
                             ((DenseVector<double> *)((long)local_d8 + uVar6 * 0x18),
                              (DenseVector<double> *)
                              ((long)&(pDVar2->values).
                                      super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                      super__Vector_impl_data._M_start +
                              (long)&(((vector<double,_std::allocator<double>_> *)local_d8)->
                                     super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                                     super__Vector_impl_data._M_start));
        local_50 = pTVar5;
        dot = (double)pTVar1;
        std::
        vector<sfm::ba::SparseMatrix<double>::Triplet,std::allocator<sfm::ba::SparseMatrix<double>::Triplet>>
        ::emplace_back<unsigned_long,unsigned_long,double&>
                  ((vector<sfm::ba::SparseMatrix<double>::Triplet,std::allocator<sfm::ba::SparseMatrix<double>::Triplet>>
                    *)auStack_88,(unsigned_long *)&local_50,(unsigned_long *)&dot,&local_48);
        local_50 = pTVar1;
        dot = (double)pTVar5;
        std::
        vector<sfm::ba::SparseMatrix<double>::Triplet,std::allocator<sfm::ba::SparseMatrix<double>::Triplet>>
        ::emplace_back<unsigned_long,unsigned_long,double&>
                  ((vector<sfm::ba::SparseMatrix<double>::Triplet,std::allocator<sfm::ba::SparseMatrix<double>::Triplet>>
                    *)auStack_88,(unsigned_long *)&local_50,(unsigned_long *)&dot,&local_48);
        uVar3 = uVar3 + 1;
        pDVar2 = columns.
                 super__Vector_base<sfm::ba::DenseVector<double>,_std::allocator<sfm::ba::DenseVector<double>_>_>
                 ._M_impl.super__Vector_impl_data._M_end_of_storage + 1;
        pTVar5 = (pointer)((long)&pTVar5->row + 1);
      }
      local_68 = local_68 + 1;
      pTVar1 = (pointer)((long)&(triplets.
                                 super__Vector_base<sfm::ba::SparseMatrix<double>::Triplet,_std::allocator<sfm::ba::SparseMatrix<double>::Triplet>_>
                                 ._M_impl.super__Vector_impl_data._M_end_of_storage)->row + 1);
      uVar6 = uVar6 + 1;
    }
    std::vector<sfm::ba::DenseVector<double>,_std::allocator<sfm::ba::DenseVector<double>_>_>::
    ~vector((vector<sfm::ba::DenseVector<double>,_std::allocator<sfm::ba::DenseVector<double>_>_> *)
            local_d8);
    uVar7 = uVar7 + local_38;
    local_58 = (pointer)((long)&local_58->row + local_38);
  }
  SparseMatrix<double>::allocate(B,uVar6,uVar6);
  SparseMatrix<double>::set_from_triplets(B,(Triplets *)auStack_88);
  std::
  _Vector_base<sfm::ba::SparseMatrix<double>::Triplet,_std::allocator<sfm::ba::SparseMatrix<double>::Triplet>_>
  ::~_Vector_base((_Vector_base<sfm::ba::SparseMatrix<double>::Triplet,_std::allocator<sfm::ba::SparseMatrix<double>::Triplet>_>
                   *)auStack_88);
  return;
}

Assistant:

void
    matrix_block_column_multiply (SparseMatrix<double> const& A,
        std::size_t block_size, SparseMatrix<double>* B)
    {
        SparseMatrix<double>::Triplets triplets;
        triplets.reserve(A.num_cols() * block_size);
        for (std::size_t block = 0; block < A.num_cols(); block += block_size)
        {
            std::vector<DenseVector<double>> columns(block_size);
            for (std::size_t col = 0; col < block_size; ++col)
                A.column_nonzeros(block + col, &columns[col]);
            for (std::size_t col = 0; col < block_size; ++col)
            {
                double dot = columns[col].dot(columns[col]);
                triplets.emplace_back(block + col, block + col, dot);
                for (std::size_t row = col + 1; row < block_size; ++row)
                {
                    dot = columns[col].dot(columns[row]);
                    triplets.emplace_back(block + row, block + col, dot);
                    triplets.emplace_back(block + col, block + row, dot);
                }
            }
        }
        B->allocate(A.num_cols(), A.num_cols());
        B->set_from_triplets(triplets);
    }